

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# string_convert.cpp
# Opt level: O1

StringBuilder * __thiscall Potassco::StringBuilder::resize(StringBuilder *this,size_t n,char c)

{
  byte bVar1;
  string *psVar2;
  byte bVar3;
  size_t sVar4;
  size_t sVar5;
  
  bVar1 = (this->field_0).sbo_[0x3f];
  bVar3 = bVar1 & 0xc0;
  if (bVar3 == 0x40) {
    sVar4 = ((this->field_0).str_)->_M_string_length;
    sVar5 = sVar4;
  }
  else if (bVar3 == 0x80) {
    sVar4 = (this->field_0).buf_.size;
    sVar5 = (this->field_0).buf_.used;
  }
  else {
    sVar4 = 0x3f;
    sVar5 = 0x3f - (ulong)bVar1;
  }
  if (n < sVar5 || n - sVar5 == 0) {
    if (n < sVar5) {
      if (bVar3 == 0x80) {
        psVar2 = (this->field_0).str_;
        (this->field_0).buf_.used = n;
        *(undefined1 *)((long)&(psVar2->_M_dataplus)._M_p + n) = 0;
      }
      else if (bVar3 == 0x40) {
        std::__cxx11::string::resize((ulong)(this->field_0).str_,(char)n);
      }
      else {
        (this->field_0).sbo_[n] = '\0';
        (this->field_0).sbo_[0x3f] = '?' - (char)n;
      }
    }
  }
  else {
    if ((bVar1 == 0x80) && (sVar4 < n)) {
      fail(-2,"StringBuilder &Potassco::StringBuilder::resize(std::size_t, char)",0x150,
           "n <= b.size || tag() != Buf","StringBuilder: buffer too small",0);
    }
    append(this,n - sVar5,c);
  }
  return this;
}

Assistant:

StringBuilder& StringBuilder::resize(std::size_t n, char c) {
	Buffer b = buffer();
	if (n > b.used) {
		POTASSCO_REQUIRE(n <= b.size || tag() != Buf, "StringBuilder: buffer too small");
		append(n - b.used, c);
	}
	else if (n < b.used) {
		if      (type() == Str) { str_->resize(n); }
		else if (type() == Buf) { buf_.head[buf_.used = n] = 0; }
		else                    { sbo_[n] = 0; setTag(static_cast<uint8_t>(SboCap - n)); }
	}
	return *this;
}